

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O3

IfcVector3 * __thiscall
Assimp::IFC::anon_unknown_9::TrimmedCurve::Eval
          (IfcVector3 *__return_storage_ptr__,TrimmedCurve *this,IfcFloat p)

{
  int iVar1;
  double extraout_XMM0_Qa;
  double in_XMM1_Qa;
  double dVar2;
  
  (*(this->super_BoundedCurve).super_Curve._vptr_Curve[5])(this);
  iVar1 = (*(this->super_BoundedCurve).super_Curve._vptr_Curve[2])(this);
  if (((char)iVar1 == '\0') &&
     ((p - extraout_XMM0_Qa <= -1.1920928955078125e-07 ||
      (in_XMM1_Qa - p <= -1.1920928955078125e-07)))) {
    __assert_fail("InRange(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0x17b,
                  "virtual IfcVector3 Assimp::IFC::(anonymous namespace)::TrimmedCurve::Eval(IfcFloat) const"
                 );
  }
  if (this->agree_sense == false) {
    dVar2 = (this->range).second - p;
  }
  else {
    dVar2 = p + (this->range).first;
  }
  (*((this->base).super___shared_ptr<const_Assimp::IFC::Curve,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    _vptr_Curve[3])(dVar2,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

IfcVector3 Eval(IfcFloat p) const {
        ai_assert(InRange(p));
        return base->Eval( TrimParam(p) );
    }